

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O2

void __thiscall
glu::Texture1DArray::Texture1DArray
          (Texture1DArray *this,RenderContext *context,deUint32 format,deUint32 dataType,int width,
          int numLevels)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TextureFormat local_28;
  
  this->m_context = context;
  this->m_format = format;
  local_28 = mapGLTransferFormat(format,dataType);
  tcu::Texture1DArray::Texture1DArray(&this->m_refTexture,&local_28,width,numLevels);
  this->m_glTexture = 0;
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f8))(1,&this->m_glTexture);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  checkError(err,"glGenTextures() failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x1e3);
  return;
}

Assistant:

Texture1DArray::Texture1DArray (const RenderContext& context, deUint32 format, deUint32 dataType, int width, int numLevels)
	: m_context			(context)
	, m_format			(format)
	, m_refTexture		(mapGLTransferFormat(format, dataType), width, numLevels)
	, m_glTexture		(0)
{
	const glw::Functions& gl = m_context.getFunctions();
	gl.genTextures(1, &m_glTexture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");
}